

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O2

bool __thiscall DIS::ModulationType::operator==(ModulationType *this,ModulationType *rhs)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined4 in_EAX;
  int iVar9;
  ushort uVar13;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar1 = this->_spreadSpectrum;
  uVar3 = this->_major;
  uVar5 = this->_detail;
  uVar7 = this->_system;
  uVar2 = rhs->_spreadSpectrum;
  uVar4 = rhs->_major;
  uVar6 = rhs->_detail;
  uVar8 = rhs->_system;
  auVar10._0_2_ = -(ushort)(uVar2 == uVar1);
  uVar13 = -(ushort)(uVar8 == uVar7);
  auVar11._0_10_ = CONCAT28(0xffff,(ulong)uVar13 << 0x30);
  auVar12._10_2_ = 0xffff;
  auVar12._0_10_ = auVar11._0_10_;
  auVar12._12_2_ = uVar13;
  auVar12._14_2_ = uVar13;
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._10_2_ = -(ushort)(uVar6 == uVar5);
  auVar10._8_8_ =
       (undefined8)(CONCAT64(auVar11._10_6_,CONCAT22(-(ushort)(uVar6 == uVar5),uVar13)) >> 0x10);
  auVar10._6_2_ = -(ushort)(uVar4 == uVar3);
  auVar10._4_2_ = -(ushort)(uVar4 == uVar3);
  auVar10._2_2_ = auVar10._0_2_;
  iVar9 = movmskps(in_EAX,auVar10);
  return iVar9 == 0xf;
}

Assistant:

bool ModulationType::operator ==(const ModulationType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_spreadSpectrum == rhs._spreadSpectrum) ) ivarsEqual = false;
     if( ! (_major == rhs._major) ) ivarsEqual = false;
     if( ! (_detail == rhs._detail) ) ivarsEqual = false;
     if( ! (_system == rhs._system) ) ivarsEqual = false;

    return ivarsEqual;
 }